

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O0

void __thiscall DFsVariable::GetValue(DFsVariable *this,svalue_t *returnvar)

{
  AActor *pAVar1;
  svalue_t *returnvar_local;
  DFsVariable *this_local;
  
  switch(this->type) {
  case 0:
    returnvar->type = this->type;
    FString::operator=(&returnvar->string,&this->string);
    break;
  default:
    returnvar->type = this->type;
    (returnvar->value).i = (this->value).i;
    break;
  case 2:
    returnvar->type = this->type;
    pAVar1 = ::TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->actor);
    (returnvar->value).mobj = pAVar1;
    break;
  case 7:
    returnvar->type = 1;
    (returnvar->value).i = *(this->value).pI;
    break;
  case 8:
    returnvar->type = 2;
    returnvar->value = *(anon_union_8_3_837bfa25_for_value *)(this->value).pMobj;
    break;
  case 9:
    returnvar->type = 1;
    (returnvar->value).i = ((this->value).ls)->number;
  }
  return;
}

Assistant:

void DFsVariable::GetValue(svalue_t &returnvar)
{
	switch (type)
	{
	case svt_pInt:
		returnvar.type = svt_int;
		returnvar.value.i = *value.pI;
		break;

	case svt_pMobj:
		returnvar.type = svt_mobj;
		returnvar.value.mobj = *value.pMobj;
		break;

	case svt_mobj:
		returnvar.type = type;
		returnvar.value.mobj = actor;
		break;

	case svt_linespec:
		returnvar.type = svt_int;
		returnvar.value.i = value.ls->number;
		break;

	case svt_string:
		returnvar.type = type;
		returnvar.string = string;
		break;

	default:
		// copy the value (also handles fixed)
		returnvar.type = type;
		returnvar.value.i = value.i;
		break;
    }
}